

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

long __thiscall
Imath_3_2::Frustum<float>::DepthToZ(Frustum<float> *this,float depth,long zmin,long zmax)

{
  float fVar1;
  float Zp_1;
  float farPlusNear_1;
  float farTimesNear;
  float Zp;
  float farPlusNear;
  float farMinusNear;
  long zdiff;
  long zmax_local;
  long zmin_local;
  float depth_local;
  Frustum<float> *this_local;
  long local_8;
  
  fVar1 = this->_farPlane - this->_nearPlane;
  if ((this->_orthographic & 1U) == 0) {
    fVar1 = (((this->_farPlane * 2.0 * this->_nearPlane) / depth + this->_farPlane +
             this->_nearPlane) / fVar1 + 1.0) * 0.5 * (float)(zmax - zmin);
  }
  else {
    fVar1 = (-(depth + depth + this->_farPlane + this->_nearPlane) / fVar1 + 1.0) * 0.5 *
            (float)(zmax - zmin);
  }
  local_8 = (long)fVar1 + zmin;
  return local_8;
}

Assistant:

IMATH_CONSTEXPR14 long
Frustum<T>::DepthToZ (T depth, long zmin, long zmax) const IMATH_NOEXCEPT
{
    long zdiff        = zmax - zmin;
    T    farMinusNear = _farPlane - _nearPlane;

    if (_orthographic)
    {
        T farPlusNear = T (2) * depth + _farPlane + _nearPlane;

        T Zp = -farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
    else
    {
        // Perspective

        T farTimesNear = T (2) * _farPlane * _nearPlane;

        T farPlusNear = farTimesNear / depth + _farPlane + _nearPlane;

        T Zp = farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
}